

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O1

bool __thiscall crnlib::etc1_optimizer::compute(etc1_optimizer *this)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  params *ppVar5;
  results *prVar6;
  uchar *__src;
  int iVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  float fVar23;
  etc1_solution_coordinates coords1;
  etc1_solution_coordinates coords;
  int local_a4;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_98;
  undefined4 local_94;
  undefined1 local_90;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_8c;
  undefined4 local_88;
  undefined1 local_84;
  potential_solution *local_80;
  potential_solution *local_78;
  int local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  float local_60;
  int local_5c;
  uint local_58;
  int local_54;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  uVar2 = this->m_pParams->m_num_src_pixels;
  lVar12 = (long)(int)this->m_pParams->m_scan_delta_size;
  if (0 < lVar12) {
    local_78 = &this->m_trial_solution;
    local_80 = &this->m_best_solution;
    local_60 = (float)uVar2;
    lVar11 = 0;
    local_40 = lVar12;
    do {
      local_70 = this->m_pParams->m_pScan_deltas[lVar11];
      uVar15 = this->m_bb + local_70;
      local_50 = lVar11;
      if ((int)uVar15 < 0) {
        bVar8 = false;
      }
      else {
        bVar8 = this->m_limit < (int)uVar15;
        if ((int)uVar15 <= this->m_limit) {
          local_6c = 0xff;
          if ((int)uVar15 < 0xff) {
            local_6c = uVar15;
          }
          lVar11 = 0;
          local_64 = uVar15;
          do {
            iVar7 = local_70;
            iVar3 = this->m_pParams->m_pScan_deltas[lVar11];
            uVar15 = this->m_bg + iVar3;
            local_48 = lVar11;
            if ((int)uVar15 < 0) {
              iVar21 = 7;
            }
            else {
              iVar21 = 5;
              if ((int)uVar15 <= this->m_limit) {
                local_68 = 0xff;
                if ((int)uVar15 < 0xff) {
                  local_68 = uVar15;
                }
                lVar11 = 0;
                do {
                  ppVar5 = this->m_pParams;
                  iVar21 = ppVar5->m_pScan_deltas[lVar11];
                  uVar13 = this->m_br + iVar21;
                  if ((int)uVar13 < 0) {
                    local_a4 = 10;
                  }
                  else {
                    local_a4 = 8;
                    if ((int)uVar13 <= this->m_limit) {
                      local_84 = ppVar5->m_use_color4;
                      uVar10 = 0xff;
                      if ((int)uVar13 < 0xff) {
                        uVar10 = uVar13;
                      }
                      local_8c.field_0.r = (uchar)uVar10;
                      local_8c.field_0.g = (uchar)local_68;
                      local_8c.field_0.b = (uchar)local_6c;
                      local_8c.field_0.a = 0xff;
                      local_88 = 0;
                      local_38 = lVar11;
                      if ((ppVar5->super_crn_etc1_pack_params).m_quality == cCRNETCQualitySlow) {
                        bVar8 = evaluate_solution(this,(etc1_solution_coordinates *)
                                                       &local_8c.field_0,local_78,local_80);
                      }
                      else {
                        bVar8 = evaluate_solution_fast
                                          (this,(etc1_solution_coordinates *)&local_8c.field_0,
                                           local_78,local_80);
                      }
                      local_a4 = 10;
                      lVar12 = local_40;
                      lVar11 = local_38;
                      if (bVar8 != false) {
                        bVar8 = iVar21 == 0 && (iVar3 == 0 && iVar7 == 0);
                        local_5c = bVar8 + 2 + (uint)bVar8;
                        if ((this->m_pParams->super_crn_etc1_pack_params).m_quality ==
                            cCRNETCQualityFast) {
                          local_5c = 2;
                        }
                        iVar21 = 0;
                        local_58 = uVar13;
                        while( true ) {
                          bVar1 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.
                                  r;
                          if ((this->m_best_solution).m_coords.m_color4 == true) {
                            uVar10 = (uint)bVar1 << 4 | (uint)bVar1;
                            bVar1 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.
                                    field_0.g;
                            uVar9 = (uint)bVar1 << 4 | (uint)bVar1;
                            bVar1 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.
                                    field_0.b;
                            uVar13 = (uint)bVar1 << 4 | (uint)bVar1;
                          }
                          else {
                            uVar10 = (uint)bVar1 << 3 | (uint)(bVar1 >> 2);
                            bVar1 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.
                                    field_0.g;
                            uVar9 = (uint)bVar1 << 3 | (uint)(bVar1 >> 2);
                            bVar1 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.
                                    field_0.b;
                            uVar13 = (uint)bVar1 << 3 | (uint)(bVar1 >> 2);
                          }
                          local_a4 = 0;
                          iVar16 = 0;
                          iVar18 = 0;
                          iVar19 = 0;
                          if (uVar2 != 0) {
                            uVar17 = 0xff;
                            if (0xfe < uVar13) {
                              uVar13 = uVar17;
                            }
                            if (0xfe < uVar9) {
                              uVar9 = 0xff;
                            }
                            if (0xfe < uVar10) {
                              uVar10 = 0xff;
                            }
                            lVar12 = 0;
                            iVar19 = 0;
                            iVar18 = 0;
                            iVar16 = 0;
                            do {
                              iVar4 = (&g_etc1_inten_tables)
                                      [(ulong)(this->m_best_solution).m_coords.m_inten_table * 4 +
                                       (ulong)(this->m_best_solution).m_selectors.m_p[lVar12]];
                              uVar14 = uVar10 + iVar4;
                              if (0xfe < (int)(uVar10 + iVar4)) {
                                uVar14 = uVar17;
                              }
                              if ((int)uVar14 < 1) {
                                uVar14 = 0;
                              }
                              uVar20 = uVar9 + iVar4;
                              if (0xfe < (int)(uVar9 + iVar4)) {
                                uVar20 = uVar17;
                              }
                              if ((int)uVar20 < 1) {
                                uVar20 = 0;
                              }
                              iVar22 = iVar4 + uVar13;
                              if (0xfe < (int)(iVar4 + uVar13)) {
                                iVar22 = 0xff;
                              }
                              if (iVar22 < 1) {
                                iVar22 = 0;
                              }
                              iVar19 = (iVar19 - uVar10) + uVar14;
                              iVar18 = (iVar18 - uVar9) + uVar20;
                              iVar16 = (iVar16 - uVar13) + iVar22;
                              lVar12 = lVar12 + 1;
                            } while (uVar2 != (uint)lVar12);
                          }
                          lVar12 = local_40;
                          lVar11 = local_38;
                          local_54 = iVar21;
                          if (((iVar19 == 0) && (iVar18 == 0)) && (iVar16 == 0)) break;
                          uVar13 = this->m_limit;
                          fVar23 = (float)(int)uVar13;
                          uVar9 = (uint)(long)((((this->m_avg_color).m_s[0] -
                                                (float)iVar19 / local_60) * fVar23) / 255.0 + 0.5);
                          uVar10 = uVar13;
                          if ((int)uVar9 < (int)uVar13) {
                            uVar10 = uVar9;
                          }
                          if ((int)uVar9 < 0) {
                            uVar10 = 0;
                          }
                          uVar17 = (uint)(long)((((this->m_avg_color).m_s[1] -
                                                 (float)iVar18 / local_60) * fVar23) / 255.0 + 0.5);
                          uVar9 = uVar13;
                          if ((int)uVar17 < (int)uVar13) {
                            uVar9 = uVar17;
                          }
                          if ((int)uVar17 < 0) {
                            uVar9 = 0;
                          }
                          uVar17 = (uint)(long)((((this->m_avg_color).m_s[2] -
                                                 (float)iVar16 / local_60) * fVar23) / 255.0 + 0.5);
                          if ((int)uVar17 < (int)uVar13) {
                            uVar13 = uVar17;
                          }
                          local_a4 = 0;
                          if ((int)uVar17 < 0) {
                            uVar13 = 0;
                          }
                          if (((((local_58 == uVar10) && (uVar15 == uVar9)) && (local_64 == uVar13))
                              || (((uVar10 == (this->m_best_solution).m_coords.m_unscaled_color.
                                              field_0.field_0.r &&
                                   (uVar9 == (this->m_best_solution).m_coords.m_unscaled_color.
                                             field_0.field_0.g)) &&
                                  (uVar13 == (this->m_best_solution).m_coords.m_unscaled_color.
                                             field_0.field_0.b)))) ||
                             (((this->m_br == uVar10 && (this->m_bg == uVar9)) &&
                              (this->m_bb == uVar13)))) break;
                          if (0xfe < (int)uVar10) {
                            uVar10 = 0xff;
                          }
                          local_90 = this->m_pParams->m_use_color4;
                          local_98.field_0.r = (uchar)uVar10;
                          if ((int)uVar10 < 1) {
                            local_98.field_0.r = '\0';
                          }
                          if (0xfe < (int)uVar9) {
                            uVar9 = 0xff;
                          }
                          local_98.field_0.g = (uchar)uVar9;
                          if ((int)uVar9 < 1) {
                            local_98.field_0.g = '\0';
                          }
                          if (0xfe < (int)uVar13) {
                            uVar13 = 0xff;
                          }
                          local_98.field_0.b = (uchar)uVar13;
                          if ((int)uVar13 < 1) {
                            local_98.field_0.b = '\0';
                          }
                          local_98.field_0.a = 0xff;
                          local_94 = 0;
                          if ((this->m_pParams->super_crn_etc1_pack_params).m_quality ==
                              cCRNETCQualitySlow) {
                            bVar8 = evaluate_solution(this,(etc1_solution_coordinates *)
                                                           &local_98.field_0,local_78,local_80);
                          }
                          else {
                            bVar8 = evaluate_solution_fast
                                              (this,(etc1_solution_coordinates *)&local_98.field_0,
                                               local_78,local_80);
                          }
                          lVar12 = local_40;
                          lVar11 = local_38;
                          if ((bVar8 == false) || (iVar21 = iVar21 + 1, iVar21 == local_5c)) break;
                        }
                      }
                    }
                  }
                } while (((local_a4 == 10) || (iVar21 = 0, local_a4 == 0)) &&
                        (lVar11 = lVar11 + 1, iVar21 = 0, lVar11 != lVar12));
              }
            }
            bVar8 = false;
          } while (((iVar21 == 7) || (iVar21 == 0)) && (lVar11 = local_48 + 1, lVar11 != lVar12));
        }
      }
    } while ((!bVar8) && (lVar11 = local_50 + 1, lVar11 != lVar12));
  }
  bVar8 = (this->m_best_solution).m_valid;
  if (bVar8 == false) {
    this->m_pResult->m_error = 0xffffffff;
  }
  else {
    prVar6 = this->m_pResult;
    __src = (this->m_best_solution).m_selectors.m_p;
    prVar6->m_error = (this->m_best_solution).m_error;
    (prVar6->m_block_color_unscaled).field_0.field_0.r =
         (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.r;
    (prVar6->m_block_color_unscaled).field_0.field_0.g =
         (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.g;
    (prVar6->m_block_color_unscaled).field_0.field_0.b =
         (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.b;
    (prVar6->m_block_color_unscaled).field_0.field_0.a =
         (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.a;
    prVar6 = this->m_pResult;
    prVar6->m_block_color4 = (this->m_best_solution).m_coords.m_color4;
    prVar6->m_block_inten_table = (this->m_best_solution).m_coords.m_inten_table;
    memcpy(prVar6->m_pSelectors,__src,(ulong)uVar2);
    this->m_pResult->m_n = uVar2;
  }
  return bVar8;
}

Assistant:

bool etc1_optimizer::compute()
    {
        const uint n = m_pParams->m_num_src_pixels;
        const int scan_delta_size = m_pParams->m_scan_delta_size;

        // Scan through a subset of the 3D lattice centered around the avg block color trying each 3D (555 or 444) lattice point as a potential block color.
        // Each time a better solution is found try to refine the current solution's block color based of the current selectors and intensity table index.
        for (int zdi = 0; zdi < scan_delta_size; zdi++)
        {
            const int zd = m_pParams->m_pScan_deltas[zdi];
            const int mbb = m_bb + zd;
            if (mbb < 0)
            {
                continue;
            }
            else if (mbb > m_limit)
            {
                break;
            }

            for (int ydi = 0; ydi < scan_delta_size; ydi++)
            {
                const int yd = m_pParams->m_pScan_deltas[ydi];
                const int mbg = m_bg + yd;
                if (mbg < 0)
                {
                    continue;
                }
                else if (mbg > m_limit)
                {
                    break;
                }

                for (int xdi = 0; xdi < scan_delta_size; xdi++)
                {
                    const int xd = m_pParams->m_pScan_deltas[xdi];
                    const int mbr = m_br + xd;
                    if (mbr < 0)
                    {
                        continue;
                    }
                    else if (mbr > m_limit)
                    {
                        break;
                    }

                    etc1_solution_coordinates coords(mbr, mbg, mbb, 0, m_pParams->m_use_color4);
                    if (m_pParams->m_quality == cCRNETCQualitySlow)
                    {
                        if (!evaluate_solution(coords, m_trial_solution, &m_best_solution))
                        {
                            continue;
                        }
                    }
                    else
                    {
                        if (!evaluate_solution_fast(coords, m_trial_solution, &m_best_solution))
                        {
                            continue;
                        }
                    }

                    // Now we have the input block, the avg. color of the input pixels, a set of trial selector indices, and the block color+intensity index.
                    // Now, for each component, attempt to refine the current solution by solving a simple linear equation. For example, for 4 colors:
                    // The goal is:
                    // pixel0 - (block_color+inten_table[selector0]) + pixel1 - (block_color+inten_table[selector1]) + pixel2 - (block_color+inten_table[selector2]) + pixel3 - (block_color+inten_table[selector3]) = 0
                    // Rearranging this:
                    // (pixel0 + pixel1 + pixel2 + pixel3) - (block_color+inten_table[selector0]) - (block_color+inten_table[selector1]) - (block_color+inten_table[selector2]) - (block_color+inten_table[selector3]) = 0
                    // (pixel0 + pixel1 + pixel2 + pixel3) - block_color - inten_table[selector0] - block_color-inten_table[selector1] - block_color-inten_table[selector2] - block_color-inten_table[selector3] = 0
                    // (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - inten_table[selector0] - inten_table[selector1] - inten_table[selector2] - inten_table[selector3] = 0
                    // (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3]) = 0
                    // (pixel0 + pixel1 + pixel2 + pixel3)/4 - block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4 = 0
                    // block_color = (pixel0 + pixel1 + pixel2 + pixel3)/4 - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4
                    // So what this means:
                    // optimal_block_color = avg_input - avg_inten_delta
                    // So the optimal block color can be computed by taking the average block color and subtracting the current average of the intensity delta.
                    // Unfortunately, optimal_block_color must then be quantized to 555 or 444 so it's not always possible to improve matters using this formula.
                    // Also, the above formula is for unclamped intensity deltas. The actual implementation takes into account clamping.

                    const uint max_refinement_trials = (m_pParams->m_quality == cCRNETCQualityFast) ? 2 : (((xd | yd | zd) == 0) ? 4 : 2);
                    for (uint refinement_trial = 0; refinement_trial < max_refinement_trials; refinement_trial++)
                    {
                        const uint8* pSelectors = m_best_solution.m_selectors.get_ptr();
                        const int* pInten_table = g_etc1_inten_tables[m_best_solution.m_coords.m_inten_table];

                        int delta_sum_r = 0, delta_sum_g = 0, delta_sum_b = 0;
                        const color_quad_u8 base_color(m_best_solution.m_coords.get_scaled_color());
                        for (uint r = 0; r < n; r++)
                        {
                            const uint s = *pSelectors++;
                            const int yd = pInten_table[s];
                            // Compute actual delta being applied to each pixel, taking into account clamping.
                            delta_sum_r += math::clamp<int>(base_color.r + yd, 0, 255) - base_color.r;
                            delta_sum_g += math::clamp<int>(base_color.g + yd, 0, 255) - base_color.g;
                            delta_sum_b += math::clamp<int>(base_color.b + yd, 0, 255) - base_color.b;
                        }
                        if ((!delta_sum_r) && (!delta_sum_g) && (!delta_sum_b))
                        {
                            break;
                        }
                        const float avg_delta_r_f = static_cast<float>(delta_sum_r) / n;
                        const float avg_delta_g_f = static_cast<float>(delta_sum_g) / n;
                        const float avg_delta_b_f = static_cast<float>(delta_sum_b) / n;
                        const int br1 = math::clamp<int>(static_cast<uint>((m_avg_color[0] - avg_delta_r_f) * m_limit / 255.0f + .5f), 0, m_limit);
                        const int bg1 = math::clamp<int>(static_cast<uint>((m_avg_color[1] - avg_delta_g_f) * m_limit / 255.0f + .5f), 0, m_limit);
                        const int bb1 = math::clamp<int>(static_cast<uint>((m_avg_color[2] - avg_delta_b_f) * m_limit / 255.0f + .5f), 0, m_limit);

                        bool skip = false;

                        if ((mbr == br1) && (mbg == bg1) && (mbb == bb1))
                        {
                            skip = true;
                        }
                        else if ((br1 == m_best_solution.m_coords.m_unscaled_color.r) && (bg1 == m_best_solution.m_coords.m_unscaled_color.g) && (bb1 == m_best_solution.m_coords.m_unscaled_color.b))
                        {
                            skip = true;
                        }
                        else if ((m_br == br1) && (m_bg == bg1) && (m_bb == bb1))
                        {
                            skip = true;
                        }

                        if (skip)
                        {
                            break;
                        }

                        etc1_solution_coordinates coords1(br1, bg1, bb1, 0, m_pParams->m_use_color4);
                        if (m_pParams->m_quality == cCRNETCQualitySlow)
                        {
                            if (!evaluate_solution(coords1, m_trial_solution, &m_best_solution))
                            {
                                break;
                            }
                        }
                        else
                        {
                            if (!evaluate_solution_fast(coords1, m_trial_solution, &m_best_solution))
                            {
                                break;
                            }
                        }

                    } // refinement_trial

                } // xdi
            } // ydi
        } // zdi

        if (!m_best_solution.m_valid)
        {
            m_pResult->m_error = cUINT32_MAX;
            return false;
        }

        const uint8* pSelectors = m_best_solution.m_selectors.get_ptr();

#ifdef CRNLIB_BUILD_DEBUG
        {
            color_quad_u8 block_colors[4];
            m_best_solution.m_coords.get_block_colors(block_colors);

            const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
            uint64 actual_error = 0;
            for (uint i = 0; i < n; i++)
                actual_error += color::elucidian_distance(pSrc_pixels[i], block_colors[pSelectors[i]], false);

            CRNLIB_ASSERT(actual_error == m_best_solution.m_error);
        }
#endif

        m_pResult->m_error = m_best_solution.m_error;

        m_pResult->m_block_color_unscaled = m_best_solution.m_coords.m_unscaled_color;
        m_pResult->m_block_color4 = m_best_solution.m_coords.m_color4;

        m_pResult->m_block_inten_table = m_best_solution.m_coords.m_inten_table;
        memcpy(m_pResult->m_pSelectors, pSelectors, n);
        m_pResult->m_n = n;

        return true;
    }